

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fIntegerStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::anon_unknown_2::ImplementationArrayTestCase::test
          (ImplementationArrayTestCase *this)

{
  CallLogWrapper *this_00;
  vector<int,_std::allocator<int>_> queryResult;
  GLint targetArrayLength;
  vector<int,_std::allocator<int>_> local_38;
  value_type_conflict1 local_20;
  GLint local_1c;
  
  (*this->m_verifier->_vptr_StateVerifier[5])
            (this->m_verifier,
             (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             (ulong)this->m_testTargetLengthTargetName,(ulong)(uint)this->m_minValue);
  ApiCase::expectError(&this->super_ApiCase,0);
  local_1c = 0;
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  glu::CallLogWrapper::glGetIntegerv(this_00,this->m_testTargetLengthTargetName,&local_1c);
  ApiCase::expectError(&this->super_ApiCase,0);
  if ((long)local_1c != 0) {
    local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (GLint *)0x0;
    local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_20 = 0;
    std::vector<int,_std::allocator<int>_>::resize(&local_38,(long)local_1c,&local_20);
    glu::CallLogWrapper::glGetIntegerv
              (this_00,this->m_testTargetName,
               local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start);
    ApiCase::expectError(&this->super_ApiCase,0);
    if (local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (GLint *)0x0) {
      operator_delete(local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void test (void)
	{
		m_verifier->verifyIntegerGreaterOrEqual(m_testCtx, m_testTargetLengthTargetName, m_minValue);
		expectError(GL_NO_ERROR);

		GLint targetArrayLength = 0;
		glGetIntegerv(m_testTargetLengthTargetName, &targetArrayLength);
		expectError(GL_NO_ERROR);

		if (targetArrayLength)
		{
			std::vector<GLint> queryResult;
			queryResult.resize(targetArrayLength, 0);

			glGetIntegerv(m_testTargetName, &queryResult[0]);
			expectError(GL_NO_ERROR);
		}
	}